

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 640x480at60_25.175MHz.c
# Opt level: O1

void vSyncLine(void)

{
  int iVar1;
  
  iVar1 = 0x50;
  do {
    putchar(5);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 1;
  do {
    putchar(5);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  iVar1 = 0xc;
  do {
    putchar(1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 6;
  do {
    putchar(5);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void vSyncLine() {

    // Blanking
    for(int i=0;i<(640/8);i++) {
        putchar(0b00000101);
    }

    // Front Porch
    for(int i=0; i<(16/8); i++) {
        putchar(0b00000101);
    }

    // hSync
    for(int i=0;i<(96/8);i++) {
        putchar(0b00000001);
    }

    // Back Porch
    for(int i=0; i<(48/8); i++) {
        putchar(0b00000101);
    }

}